

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3ResultSetOfSelect(Parse *pParse,Select *pSelect,char aff)

{
  long in_RSI;
  undefined8 *in_RDI;
  u64 savedFlags;
  sqlite3 *db;
  Table *pTab;
  Select *in_stack_00000030;
  Table *in_stack_00000038;
  Parse *in_stack_00000040;
  ExprList *in_stack_00000048;
  Parse *in_stack_00000050;
  Select *p;
  sqlite3 *db_00;
  long local_18;
  Table *local_8;
  
  db_00 = (sqlite3 *)*in_RDI;
  p = (Select *)db_00->flags;
  db_00->flags = db_00->flags & 0xfffffffffffffffb;
  db_00->flags = db_00->flags | 0x40;
  sqlite3SelectPrep((Parse *)db_00,p,(NameContext *)0x1d70a0);
  db_00->flags = (u64)p;
  local_18 = in_RSI;
  if (*(int *)((long)in_RDI + 0x34) == 0) {
    for (; *(long *)(local_18 + 0x50) != 0; local_18 = *(long *)(local_18 + 0x50)) {
    }
    local_8 = (Table *)sqlite3DbMallocZero(db_00,(u64)p);
    if (local_8 == (Table *)0x0) {
      local_8 = (Table *)0x0;
    }
    else {
      local_8->nTabRef = 1;
      local_8->zName = (char *)0x0;
      local_8->nRowLogEst = 200;
      sqlite3ColumnsFromExprList
                (in_stack_00000050,in_stack_00000048,(i16 *)in_stack_00000040,
                 (Column **)in_stack_00000038);
      sqlite3SubqueryColumnTypes(in_stack_00000040,in_stack_00000038,in_stack_00000030,pParse._7_1_)
      ;
      local_8->iPKey = -1;
      if (db_00->mallocFailed != '\0') {
        sqlite3DeleteTable(db_00,(Table *)p);
        local_8 = (Table *)0x0;
      }
    }
  }
  else {
    local_8 = (Table *)0x0;
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3ResultSetOfSelect(Parse *pParse, Select *pSelect, char aff){
  Table *pTab;
  sqlite3 *db = pParse->db;
  u64 savedFlags;

  savedFlags = db->flags;
  db->flags &= ~(u64)SQLITE_FullColNames;
  db->flags |= SQLITE_ShortColNames;
  sqlite3SelectPrep(pParse, pSelect, 0);
  db->flags = savedFlags;
  if( pParse->nErr ) return 0;
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  pTab = sqlite3DbMallocZero(db, sizeof(Table) );
  if( pTab==0 ){
    return 0;
  }
  pTab->nTabRef = 1;
  pTab->zName = 0;
  pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
  sqlite3ColumnsFromExprList(pParse, pSelect->pEList, &pTab->nCol, &pTab->aCol);
  sqlite3SubqueryColumnTypes(pParse, pTab, pSelect, aff);
  pTab->iPKey = -1;
  if( db->mallocFailed ){
    sqlite3DeleteTable(db, pTab);
    return 0;
  }
  return pTab;
}